

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_utility.cpp
# Opt level: O3

void R_InterpolateView(player_t *player,double Frac,InterpolationViewer *iview)

{
  instance *piVar1;
  FDisplacement *pFVar2;
  DVector2 *pDVar3;
  int iVar4;
  undefined1 auVar5 [16];
  double dVar6;
  FSectorPortal *pFVar7;
  uint uVar8;
  int iVar9;
  subsector_t *psVar10;
  DVector3a *pDVar11;
  uint uVar12;
  DVector3a *pDVar13;
  double *pdVar14;
  DAngle *pDVar15;
  ulong uVar16;
  ulong uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 in_XMM0_Dc;
  undefined4 uVar20;
  undefined4 in_XMM0_Dd;
  undefined4 uVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  undefined1 auVar25 [16];
  double dVar26;
  double dVar27;
  undefined1 local_108 [40];
  double local_e0;
  DAngle local_c0;
  undefined1 local_b8 [16];
  player_t *local_a8;
  double local_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  InterpolationViewer *local_78;
  double local_70;
  double local_68;
  DAngle *local_60;
  double local_58;
  double local_50;
  double local_48;
  double dStack_40;
  
  local_98._8_4_ = in_XMM0_Dc;
  local_98._0_8_ = Frac;
  local_98._12_4_ = in_XMM0_Dd;
  if (NoInterpolateView) {
    if (InterpolationPath.Count != 0) {
      InterpolationPath.Count = 0;
    }
    NoInterpolateView = false;
    auVar25._0_8_ = (iview->New).Pos.X;
    auVar25._8_8_ = (iview->New).Pos.Y;
    dVar24 = (iview->New).Pos.Z;
    dVar22 = (iview->New).Angles.Pitch.Degrees;
    local_e0 = (iview->New).Angles.Yaw.Degrees;
    dVar27 = (iview->New).Angles.Roll.Degrees;
    local_b8._0_8_ = (iview->New).Angles.Yaw;
    local_b8._8_8_ = (iview->New).Angles.Roll;
    (iview->Old).Pos.X = (double)auVar25._0_8_;
    (iview->Old).Pos.Y = (double)auVar25._8_8_;
    (iview->Old).Angles.Yaw.Degrees = local_e0;
    (iview->Old).Angles.Roll.Degrees = dVar27;
    (iview->Old).Pos.Z = dVar24;
    (iview->Old).Angles.Pitch.Degrees = dVar22;
    local_108._0_16_ = auVar25;
  }
  else {
    auVar25._0_8_ = (iview->Old).Pos.X;
    auVar25._8_8_ = (iview->Old).Pos.Y;
    local_108._0_8_ = (iview->New).Pos.X;
    local_108._8_8_ = (iview->New).Pos.Y;
    local_e0 = (iview->Old).Angles.Yaw.Degrees;
    local_b8._8_8_ = 0;
    local_b8._0_8_ = (iview->New).Angles.Yaw.Degrees;
  }
  dVar24 = auVar25._0_8_;
  dVar27 = auVar25._8_8_;
  psVar10 = R_PointInSubsector(SUB84(dVar24 + 103079215104.0,0),SUB84(dVar27 + 103079215104.0,0));
  iVar9 = psVar10->sector->PortalGroup;
  dVar22 = local_108._0_8_;
  dVar26 = local_108._8_8_;
  local_88._8_4_ = local_108._8_4_;
  local_88._0_8_ = dVar26;
  local_88._12_4_ = local_108._12_4_;
  psVar10 = R_PointInSubsector(SUB84(dVar22 + 103079215104.0,0),SUB84(dVar26 + 103079215104.0,0));
  if (cl_capfps.Value != false) {
    ViewPos.Z = (iview->New).Pos.Z;
    ViewPos.X = (double)local_108._0_8_;
    ViewPos.Y = (double)local_108._8_8_;
    ViewPath[1].X = (double)local_108._0_8_;
    ViewPath[1].Y = (double)local_108._8_8_;
    ViewPath[0].X = (double)local_108._0_8_;
    ViewPath[0].Y = (double)local_108._8_8_;
    ViewPath[0].Z = ViewPos.Z;
    ViewPath[1].Z = ViewPos.Z;
    goto LAB_004762ec;
  }
  iVar4 = psVar10->sector->PortalGroup;
  if ((dVar24 != dVar22) || (NAN(dVar24) || NAN(dVar22))) {
LAB_00475e74:
    if (InterpolationPath.Count != 0) {
      if (r_showviewer == false) {
        local_68 = (iview->Old).Pos.Z;
        local_70 = (iview->New).Pos.Z;
        uVar16 = 0;
        local_a0 = 0.0;
        local_c0.Degrees = 0.0;
        local_48 = dVar24;
        dStack_40 = dVar27;
        TArray<DVector3a,_DVector3a>::Grow(&InterpolationPath,1);
        pDVar13 = InterpolationPath.Array;
        pDVar11 = InterpolationPath.Array + InterpolationPath.Count;
        (pDVar11->pos).X = dVar22;
        (pDVar11->pos).Y = dVar26;
        pdVar14 = &pDVar13[InterpolationPath.Count].pos.Z;
        *pdVar14 = 0.0;
        pdVar14[1] = 0.0;
        InterpolationPath.Count = InterpolationPath.Count + 1;
        if (InterpolationPath.Count == 0) {
          local_108._0_8_ = 0.0;
        }
        else {
          local_a8 = player;
          local_108._0_8_ = 0.0;
          uVar18 = 0;
          uVar19 = 0;
          dVar24 = 0.0;
          dVar27 = 0.0;
          do {
            iVar9 = (int)uVar16;
            uVar8 = iVar9 - 1;
            pdVar14 = &InterpolationPath.Array[uVar8].pos.Z;
            if (iVar9 == 0) {
              pdVar14 = &local_a0;
            }
            pDVar15 = &InterpolationPath.Array[uVar8].angle;
            if (iVar9 == 0) {
              pDVar15 = &local_c0;
            }
            pDVar11 = InterpolationPath.Array + uVar8;
            if (iVar9 == 0) {
              pDVar11 = (DVector3a *)&local_48;
            }
            dVar23 = InterpolationPath.Array[uVar16].pos.Y - (pDVar11->pos).Y;
            dVar22 = InterpolationPath.Array[uVar16].pos.X - (pDVar11->pos).X;
            dVar26 = InterpolationPath.Array[uVar16].pos.Z - *pdVar14;
            dVar22 = c_sqrt(dVar26 * dVar26 + dVar23 * dVar23 + dVar22 * dVar22);
            dVar24 = dVar24 + *pdVar14;
            dVar27 = dVar27 + pDVar15->Degrees;
            local_108._0_8_ = (double)local_108._0_8_ + dVar22;
            uVar16 = (ulong)(iVar9 + 2U);
          } while (iVar9 + 2U < InterpolationPath.Count);
          player = local_a8;
          if (InterpolationPath.Count != 0) {
            local_78 = iview;
            dVar22 = (double)local_108._0_8_ * (double)local_98._0_8_;
            uVar8 = 0;
            dVar26 = 0.0;
            dVar23 = 0.0;
            do {
              pDVar11 = InterpolationPath.Array;
              local_58 = dVar26;
              local_50 = dVar23;
              local_88._8_4_ = uVar18;
              local_88._0_8_ = dVar22;
              local_88._12_4_ = uVar19;
              uVar12 = uVar8 - 1;
              pdVar14 = &InterpolationPath.Array[uVar12].pos.Z;
              if (uVar8 == 0) {
                pdVar14 = &local_a0;
              }
              local_60 = &InterpolationPath.Array[uVar12].angle;
              if (uVar8 == 0) {
                local_60 = &local_c0;
              }
              pDVar13 = InterpolationPath.Array + uVar12;
              if (uVar8 == 0) {
                pDVar13 = (DVector3a *)&local_48;
              }
              dVar23 = InterpolationPath.Array[uVar8].pos.Y - (pDVar13->pos).Y;
              dVar22 = InterpolationPath.Array[uVar8].pos.X - (pDVar13->pos).X;
              dVar26 = InterpolationPath.Array[uVar8].pos.Z - *pdVar14;
              dVar6 = c_sqrt(dVar26 * dVar26 + dVar23 * dVar23 + dVar22 * dVar22);
              uVar18 = local_88._8_4_;
              uVar19 = local_88._12_4_;
              dVar26 = local_58 + *pdVar14;
              dVar23 = local_50 + local_60->Degrees;
              dVar22 = local_88._0_8_;
              if (dVar22 < dVar6) {
                local_e0 = local_e0 + dVar23;
                auVar5._8_4_ = local_b8._8_4_;
                auVar5._0_8_ = local_b8._0_8_ - (dVar27 - dVar23);
                auVar5._12_4_ = local_b8._12_4_;
                local_b8 = auVar5;
                ViewPos.Z = ((local_70 - (dVar24 - dVar26)) - (local_68 + dVar26)) *
                            (double)local_98._0_8_ + local_68 + dVar26;
                dVar24 = (pDVar13->pos).X;
                dVar27 = (pDVar13->pos).Y;
                dVar27 = (dVar22 / dVar6) * (pDVar11[uVar8].pos.Y - dVar27) + dVar27;
                ViewPos.Y._0_4_ = SUB84(dVar27,0);
                ViewPos.X = (dVar22 / dVar6) * (pDVar11[uVar8].pos.X - dVar24) + dVar24;
                ViewPos.Y._4_4_ = (int)((ulong)dVar27 >> 0x20);
                break;
              }
              dVar22 = dVar22 - dVar6;
              uVar8 = uVar8 + 2;
            } while (uVar8 < InterpolationPath.Count);
            player = local_a8;
            iview = local_78;
            if (InterpolationPath.Count != 0) {
              InterpolationPath.Count = InterpolationPath.Count - 1;
            }
          }
        }
        ViewPath[0].Z = (iview->Old).Pos.Z;
        piVar1 = &iview->Old;
        ViewPath[0].X = (piVar1->Pos).X;
        ViewPath[0].Y = (piVar1->Pos).Y;
        dVar24 = ((InterpolationPath.Array)->pos).X - (piVar1->Pos).X;
        dVar22 = ((InterpolationPath.Array)->pos).Y - (iview->Old).Pos.Y;
        dVar27 = c_sqrt(dVar22 * dVar22 + dVar24 * dVar24);
        ViewPath[1].Z = ViewPath[0].Z;
        ViewPath[1].Y = ((double)local_108._0_8_ / dVar27) * dVar22 + ViewPath[0].Y;
        ViewPath[1].X = ((double)local_108._0_8_ / dVar27) * dVar24 + ViewPath[0].X;
      }
      goto LAB_004762ec;
    }
  }
  else if ((dVar27 != (double)local_88._0_8_) || (NAN(dVar27) || NAN((double)local_88._0_8_)))
  goto LAB_00475e74;
  uVar18 = 0;
  uVar19 = 0;
  uVar20 = 0;
  uVar21 = 0;
  if (iVar9 != iVar4) {
    pFVar2 = Displacements.data.Array + (iVar4 * Displacements.size + iVar9);
    uVar18 = *(undefined4 *)&(pFVar2->pos).X;
    uVar19 = *(undefined4 *)((long)&(pFVar2->pos).X + 4);
    uVar20 = *(undefined4 *)&(pFVar2->pos).Y;
    uVar21 = *(undefined4 *)((long)&(pFVar2->pos).Y + 4);
  }
  dVar23 = (iview->Old).Pos.Z;
  ViewPath[0].Z = (iview->New).Pos.Z;
  ViewPath[1].X = (double)local_108._0_8_;
  ViewPath[1].Y = (double)local_108._8_8_;
  ViewPos.Z = (ViewPath[0].Z - dVar23) * (double)local_98._0_8_ + dVar23;
  dVar27 = (double)local_98._0_8_ * ((dVar26 - dVar27) - (double)CONCAT44(uVar21,uVar20)) + dVar27;
  ViewPos.Y._0_4_ = SUB84(dVar27,0);
  ViewPos.X = (double)local_98._0_8_ * ((dVar22 - dVar24) - (double)CONCAT44(uVar19,uVar18)) +
              dVar24;
  ViewPos.Y._4_4_ = (int)((ulong)dVar27 >> 0x20);
  ViewPath[0].X = (double)local_108._0_8_;
  ViewPath[0].Y = (double)local_108._8_8_;
  ViewPath[1].Z = ViewPath[0].Z;
LAB_004762ec:
  if ((((((player == (player_t *)0x0) || (((uint)player->cheats >> 0xe & 1) != 0)) ||
        (((long)&player[-0x9192].secretcount >> 5) * -0x30c30c30c30c30c3 - (long)consoleplayer != 0)
        ) || (((APlayerPawn *)camera != player->mo || (demoplayback != false)))) ||
      (((dVar27 = (iview->New).Pos.X, dVar27 != (camera->__Pos).X ||
        ((NAN(dVar27) || NAN((camera->__Pos).X) || ((player->cheats & 0x1040U) != 0)))) ||
       (dVar27 = (iview->New).Pos.Y, pdVar14 = &(camera->__Pos).Y, dVar27 != *pdVar14)))) ||
     (((((NAN(dVar27) || NAN(*pdVar14) || (player->playerstate != '\0')) ||
        ((player->mo->super_AActor).reactiontime != 0)) ||
       (((NoInterpolateView != false || (paused != 0)) ||
        ((netgame == true && (cl_noprediction.Value != false)))))) || (LocalKeyboardTurner != false)
      ))) {
    dVar27 = (iview->Old).Angles.Pitch.Degrees;
    ViewPitch.Degrees =
         (double)SUB84(((double)SUB84(((iview->New).Angles.Pitch.Degrees - dVar27) *
                                      11930464.711111112 + 6755399441055744.0,0) *
                        8.381903171539307e-08 * (double)local_98._0_8_ + dVar27) *
                       11930464.711111112 + 6755399441055744.0,0) * 8.381903171539307e-08;
    iVar9 = SUB84(((double)SUB84(((double)local_b8._0_8_ - local_e0) * 11930464.711111112 +
                                 6755399441055744.0,0) * 8.381903171539307e-08 *
                   (double)local_98._0_8_ + local_e0) * 11930464.711111112 + 6755399441055744.0,0);
    dVar27 = (iview->Old).Angles.Roll.Degrees;
    dVar27 = (double)SUB84(((iview->New).Angles.Roll.Degrees - dVar27) * 11930464.711111112 +
                           6755399441055744.0,0) * 8.381903171539307e-08 * (double)local_98._0_8_ +
             dVar27;
  }
  else {
    iVar9 = SUB84(((double)local_b8._0_8_ +
                  (double)((ulong)LocalViewAngle._2_2_ << 0x10) * 8.381903171539307e-08) *
                  11930464.711111112 + 6755399441055744.0,0);
    dVar27 = 0.0;
    if (player->centering == false) {
      dVar27 = (double)(int)((uint)LocalViewPitch._2_2_ << 0x10) * 8.381903171539307e-08;
    }
    dVar22 = (double)SUB84(((iview->New).Angles.Pitch.Degrees - dVar27) * 11930464.711111112 +
                           6755399441055744.0,0) * 8.381903171539307e-08;
    dVar27 = (player->MinPitch).Degrees;
    dVar24 = (player->MaxPitch).Degrees;
    uVar16 = -(ulong)(dVar24 <= dVar22);
    uVar17 = -(ulong)(dVar27 < dVar22);
    ViewPitch.Degrees =
         (double)(~uVar17 & (ulong)dVar27 |
                 (uVar16 & (ulong)dVar24 | ~uVar16 & (ulong)dVar22) & uVar17);
    dVar27 = (iview->New).Angles.Roll.Degrees;
  }
  ViewAngle.Degrees = (double)iVar9 * 8.381903171539307e-08;
  ViewRoll.Degrees =
       (double)SUB84(dVar27 * 11930464.711111112 + 6755399441055744.0,0) * 8.381903171539307e-08;
  local_108._0_8_ = ViewPos.X;
  local_108._8_8_ = ViewPos.Y;
  psVar10 = R_PointInSubsector(SUB84(ViewPos.X + 103079215104.0,0),
                               SUB84(ViewPos.Y + 103079215104.0,0));
  dVar27 = ViewPos.Z;
  pFVar7 = sectorPortals.Array;
  viewsector = (sector_t *)psVar10->sector;
  if ((((sector_t_conflict *)viewsector)->planes[1].Flags & 0x1d0U) == 0x100) {
    uVar16 = (ulong)((sector_t_conflict *)viewsector)->Portals[1];
    dVar24 = sectorPortals.Array[uVar16].mPlaneZ;
    if (dVar24 < ViewPos.Z) {
      do {
        pDVar3 = &pFVar7[uVar16].mDisplacement;
        local_108._0_8_ = pDVar3->X + (double)local_108._0_8_;
        local_108._8_8_ = pDVar3->Y + (double)local_108._8_8_;
        ViewPos.Y = (double)local_108._8_8_;
        ViewPos.X = (double)local_108._0_8_;
        psVar10 = R_PointInSubsector(SUB84((double)local_108._0_8_ + 103079215104.0,0),
                                     SUB84((double)local_108._8_8_ + 103079215104.0,0));
        viewsector = (sector_t *)psVar10->sector;
        if ((((sector_t_conflict *)viewsector)->planes[1].Flags & 0x1d0U) != 0x100) {
          return;
        }
        uVar16 = (ulong)((sector_t_conflict *)viewsector)->Portals[1];
        pdVar14 = &pFVar7[uVar16].mPlaneZ;
      } while (*pdVar14 <= dVar27 && dVar27 != *pdVar14);
    }
    if (dVar24 < dVar27) {
      return;
    }
  }
  dVar27 = ViewPos.Z;
  pFVar7 = sectorPortals.Array;
  uVar8 = viewsector->planes[0].Flags;
  while (((uVar8 & 0x1d0) == 0x100 &&
         (dVar27 < pFVar7[((sector_t_conflict *)viewsector)->Portals[0]].mPlaneZ))) {
    pDVar3 = &pFVar7[((sector_t_conflict *)viewsector)->Portals[0]].mDisplacement;
    local_108._0_8_ = (double)local_108._0_8_ + pDVar3->X;
    local_108._8_8_ = (double)local_108._8_8_ + pDVar3->Y;
    ViewPos.Y = (double)local_108._8_8_;
    ViewPos.X = (double)local_108._0_8_;
    psVar10 = R_PointInSubsector(SUB84((double)local_108._0_8_ + 103079215104.0,0),
                                 SUB84((double)local_108._8_8_ + 103079215104.0,0));
    viewsector = (sector_t *)psVar10->sector;
    uVar8 = ((sector_t_conflict *)viewsector)->planes[0].Flags;
  }
  ViewPos.X = (double)ViewPos.X;
  ViewPos.Y = (double)ViewPos.Y;
  ViewPath[0].X = (double)ViewPath[0].X;
  ViewPath[0].Y = (double)ViewPath[0].Y;
  ViewPath[1].X = (double)ViewPath[1].X;
  ViewPath[1].Y = (double)ViewPath[1].Y;
  return;
}

Assistant:

void R_InterpolateView (player_t *player, double Frac, InterpolationViewer *iview)
{
	if (NoInterpolateView)
	{
		InterpolationPath.Clear();
		NoInterpolateView = false;
		iview->Old = iview->New;
	}
	int oldgroup = R_PointInSubsector(iview->Old.Pos)->sector->PortalGroup;
	int newgroup = R_PointInSubsector(iview->New.Pos)->sector->PortalGroup;

	DAngle oviewangle = iview->Old.Angles.Yaw;
	DAngle nviewangle = iview->New.Angles.Yaw;
	if (!cl_capfps)
	{
		if ((iview->Old.Pos.X != iview->New.Pos.X || iview->Old.Pos.Y != iview->New.Pos.Y) && InterpolationPath.Size() > 0)
		{
			DVector3 view = iview->New.Pos;

			// Interpolating through line portals is a messy affair.
			// What needs be done is to store the portal transitions of the camera actor as waypoints
			// and then find out on which part of the path the current view lies.
			// Needless to say, this doesn't work for chasecam mode.
			if (!r_showviewer)
			{
				double pathlen = 0;
				double zdiff = 0;
				double totalzdiff = 0;
				DAngle adiff = 0.;
				DAngle totaladiff = 0.;
				double oviewz = iview->Old.Pos.Z;
				double nviewz = iview->New.Pos.Z;
				DVector3a oldpos = { { iview->Old.Pos.X, iview->Old.Pos.Y, 0 }, 0. };
				DVector3a newpos = { { iview->New.Pos.X, iview->New.Pos.Y, 0 }, 0. };
				InterpolationPath.Push(newpos);	// add this to  the array to simplify the loops below

				for (unsigned i = 0; i < InterpolationPath.Size(); i += 2)
				{
					DVector3a &start = i == 0 ? oldpos : InterpolationPath[i - 1];
					DVector3a &end = InterpolationPath[i];
					pathlen += (end.pos - start.pos).Length();
					totalzdiff += start.pos.Z;
					totaladiff += start.angle;
				}
				double interpolatedlen = Frac * pathlen;

				for (unsigned i = 0; i < InterpolationPath.Size(); i += 2)
				{
					DVector3a &start = i == 0 ? oldpos : InterpolationPath[i - 1];
					DVector3a &end = InterpolationPath[i];
					double fraglen = (end.pos - start.pos).Length();
					zdiff += start.pos.Z;
					adiff += start.angle;
					if (fraglen <= interpolatedlen)
					{
						interpolatedlen -= fraglen;
					}
					else
					{
						double fragfrac = interpolatedlen / fraglen;
						oviewz += zdiff;
						nviewz -= totalzdiff - zdiff;
						oviewangle += adiff;
						nviewangle -= totaladiff - adiff;
						DVector2 viewpos = start.pos + (fragfrac * (end.pos - start.pos));
						ViewPos = { viewpos, oviewz + Frac * (nviewz - oviewz) };
						break;
					}
				}
				InterpolationPath.Pop();
				ViewPath[0] = iview->Old.Pos;
				ViewPath[1] = ViewPath[0] + (InterpolationPath[0].pos - ViewPath[0]).XY().MakeResize(pathlen);
			}
		}
		else
		{
			DVector2 disp = Displacements.getOffset(oldgroup, newgroup);
			ViewPos = iview->Old.Pos + (iview->New.Pos - iview->Old.Pos - disp) * Frac;
			ViewPath[0] = ViewPath[1] = iview->New.Pos;
		}
	}
	else
	{
		ViewPos = iview->New.Pos;
		ViewPath[0] = ViewPath[1] = iview->New.Pos;
	}
	if (player != NULL &&
		!(player->cheats & CF_INTERPVIEW) &&
		player - players == consoleplayer &&
		camera == player->mo &&
		!demoplayback &&
		iview->New.Pos.X == camera->X() &&
		iview->New.Pos.Y == camera->Y() && 
		!(player->cheats & (CF_TOTALLYFROZEN|CF_FROZEN)) &&
		player->playerstate == PST_LIVE &&
		player->mo->reactiontime == 0 &&
		!NoInterpolateView &&
		!paused &&
		(!netgame || !cl_noprediction) &&
		!LocalKeyboardTurner)
	{
		ViewAngle = (nviewangle + AngleToFloat(LocalViewAngle & 0xFFFF0000)).Normalized180();
		DAngle delta = player->centering ? DAngle(0.) : AngleToFloat(int(LocalViewPitch & 0xFFFF0000));
		ViewPitch = clamp<DAngle>((iview->New.Angles.Pitch - delta).Normalized180(), player->MinPitch, player->MaxPitch);
		ViewRoll = iview->New.Angles.Roll.Normalized180();
	}
	else
	{
		ViewPitch = (iview->Old.Angles.Pitch + deltaangle(iview->Old.Angles.Pitch, iview->New.Angles.Pitch) * Frac).Normalized180();
		ViewAngle = (oviewangle + deltaangle(oviewangle, nviewangle) * Frac).Normalized180();
		ViewRoll = (iview->Old.Angles.Roll + deltaangle(iview->Old.Angles.Roll, iview->New.Angles.Roll) * Frac).Normalized180();
	}
	
	// Due to interpolation this is not necessarily the same as the sector the camera is in.
	viewsector = R_PointInSubsector(ViewPos)->sector;
	bool moved = false;
	while (!viewsector->PortalBlocksMovement(sector_t::ceiling))
	{
		if (ViewPos.Z > viewsector->GetPortalPlaneZ(sector_t::ceiling))
		{
			ViewPos += viewsector->GetPortalDisplacement(sector_t::ceiling);
			viewsector = R_PointInSubsector(ViewPos)->sector;
			moved = true;
		}
		else break;
	}
	if (!moved)
	{
		while (!viewsector->PortalBlocksMovement(sector_t::floor))
		{
			if (ViewPos.Z < viewsector->GetPortalPlaneZ(sector_t::floor))
			{
				ViewPos += viewsector->GetPortalDisplacement(sector_t::floor);
				viewsector = R_PointInSubsector(ViewPos)->sector;
				moved = true;
			}
			else break;
		}
	}
}